

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids::~IfcArbitraryProfileDefWithVoids
          (IfcArbitraryProfileDefWithVoids *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  void *pvVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  
  (this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcArbitraryProfileDefWithVoids_009469f0;
  *(undefined ***)&this->field_0x98 = &PTR__IfcArbitraryProfileDefWithVoids_00946a68;
  *(undefined ***)&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.field_0x58 =
       &PTR__IfcArbitraryProfileDefWithVoids_00946a18;
  *(undefined ***)&(this->super_IfcArbitraryClosedProfileDef).field_0x70 =
       &PTR__IfcArbitraryProfileDefWithVoids_00946a40;
  pvVar3 = *(void **)&(this->super_IfcArbitraryClosedProfileDef).field_0x80;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this->field_0x90 - (long)pvVar3);
  }
  (this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x946b80;
  *(undefined8 *)&this->field_0x98 = 0x946ba8;
  pcVar4 = (this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.ProfileName.ptr.
           _M_dataplus._M_p;
  paVar1 = &(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.ProfileName.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  puVar5 = *(undefined1 **)
            &(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10;
  puVar2 = &(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  if (puVar5 != puVar2) {
    operator_delete(puVar5,*(long *)puVar2 + 1);
  }
  operator_delete(this,0xb0);
  return;
}

Assistant:

IfcArbitraryProfileDefWithVoids() : Object("IfcArbitraryProfileDefWithVoids") {}